

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O0

void __thiscall Personality::PersonalityConsequences(Personality *this)

{
  Item *this_00;
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  reference ppIVar4;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<Item_*> local_38;
  iterator iti;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<Follower_*> local_18;
  iterator itf;
  Personality *this_local;
  
  itf._M_node = (_List_node_base *)this;
  std::_List_iterator<Follower_*>::_List_iterator(&local_18);
  bVar1 = std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::empty(&this->followers);
  if (!bVar1) {
    local_20 = (_List_node_base *)
               std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::begin(&this->followers);
    local_18._M_node = local_20;
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::end(&this->followers);
      bVar1 = std::operator!=(&local_18,&local_28);
      if (!bVar1) break;
      ppFVar3 = std::_List_iterator<Follower_*>::operator*(&local_18);
      Follower::setTapped(*ppFVar3,true);
      iti._M_node = (_List_node_base *)std::_List_iterator<Follower_*>::operator++(&local_18,0);
    }
  }
  std::_List_iterator<Item_*>::_List_iterator(&local_38);
  bVar1 = std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::empty(&this->items);
  if (!bVar1) {
    local_40 = (_List_node_base *)
               std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::begin(&this->items);
    local_38._M_node = local_40;
    while( true ) {
      local_48._M_node =
           (_List_node_base *)std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::end(&this->items)
      ;
      bVar1 = std::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      ppIVar4 = std::_List_iterator<Item_*>::operator*(&local_38);
      this_00 = *ppIVar4;
      ppIVar4 = std::_List_iterator<Item_*>::operator*(&local_38);
      iVar2 = Item::getDurability(*ppIVar4);
      Item::setDurability(this_00,iVar2 + -1);
      std::_List_iterator<Item_*>::operator++(&local_38,0);
    }
  }
  return;
}

Assistant:

void Personality::PersonalityConsequences()
{
    list<Follower*>::iterator itf;
    if (!followers.empty())
    {
        for (itf=followers.begin(); itf!=followers.end(); itf++)
            (*itf)->setTapped(true);
    }

    list<Item*>::iterator iti;
    if (!items.empty())
    {
        for (iti=items.begin(); iti!=items.end(); iti++)
            (*iti)->setDurability((*iti)->getDurability()-1);
    }
}